

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall banksia::ChessBoard::make(ChessBoard *this,MoveFull *move,Hist *hist)

{
  PieceType PVar1;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  uint64_t uVar7;
  ulong uVar8;
  reference pvVar9;
  undefined8 *in_RDX;
  int *in_RSI;
  long *in_RDI;
  int ep;
  int d;
  int newRookPos;
  int rookPos;
  value_type p;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  PieceType local_20;
  Side SStack_1c;
  
  *(int *)((long)in_RDX + 0x1c) = (int)in_RDI[0x16];
  *(int *)(in_RDX + 4) = (int)in_RDI[8];
  *(undefined1 *)((long)in_RDX + 0x24) = *(undefined1 *)((long)in_RDI + 0xb4);
  *(undefined1 *)((long)in_RDX + 0x25) = *(undefined1 *)((long)in_RDI + 0xb5);
  *in_RDX = *(undefined8 *)in_RSI;
  in_RDX[1] = *(undefined8 *)(in_RSI + 2);
  *(int *)(in_RDX + 2) = in_RSI[4];
  pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                      (long)in_RSI[1]);
  *(value_type *)((long)in_RDX + 0x14) = *pvVar6;
  in_RDX[5] = in_RDI[0xf];
  *(int *)(in_RDX + 6) = (int)in_RDI[0xe];
  uVar7 = hashKeyEnpassant((ChessBoard *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (int)((ulong)in_RDI >> 0x20));
  in_RDI[0xf] = uVar7 ^ in_RDI[0xf];
  uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,*in_RSI);
  in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
  bVar3 = Piece::isEmpty((Piece *)((long)in_RDX + 0x14));
  if (!bVar3) {
    uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_RSI[1]);
    in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
  }
  pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                      (long)*in_RSI);
  vVar2 = *pvVar6;
  pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                     ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                      (long)in_RSI[1]);
  *pvVar6 = vVar2;
  std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
            ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),(long)*in_RSI);
  Piece::setEmpty((Piece *)0x1eb049);
  uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_RSI[1]);
  in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
  *(int *)(in_RDI + 0xe) = (int)in_RDI[0xe] + 1;
  *(undefined4 *)(in_RDI + 0x16) = 0xffffffff;
  if (((int)*(char *)((long)in_RDI + 0xb4) + (int)*(char *)((long)in_RDI + 0xb5) != 0) &&
     (*(int *)((long)in_RDX + 0x14) == 3)) {
    (**(code **)(*in_RDI + 200))(in_RDI,in_RSI[1],*(undefined4 *)(in_RDX + 3));
  }
  local_20 = vVar2.type;
  SStack_1c = vVar2.side;
  if (local_20 == king) {
    *(byte *)((long)in_RDI + (long)(int)SStack_1c + 0xb4) =
         *(byte *)((long)in_RDI + (long)(int)SStack_1c + 0xb4) &
         (((byte)(int)in_RDI[0x14] | (byte)*(undefined4 *)((long)in_RDI + 0xa4)) ^ 0xff);
    iVar4 = *in_RSI - in_RSI[1];
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 == 2) {
      iVar4 = -4;
      if (*in_RSI < in_RSI[1]) {
        iVar4 = 3;
      }
      iVar4 = *in_RSI + iVar4;
      iVar5 = (*in_RSI + in_RSI[1]) / 2;
      uVar8 = (**(code **)(*in_RDI + 0x80))
                        (in_RDI,iVar4,(long)(*in_RSI + in_RSI[1]) % 2 & 0xffffffff);
      in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
      pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                         ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                          (long)iVar4);
      pvVar9 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                         ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                          (long)iVar5);
      *pvVar9 = *pvVar6;
      std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),(long)iVar4
                );
      Piece::setEmpty((Piece *)0x1eb1e9);
      uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,iVar5);
      in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
      *(undefined4 *)(in_RDI + 0xe) = 0;
    }
  }
  else if (local_20 == rook) {
    if ((int)*(char *)((long)in_RDI + 0xb4) + (int)*(char *)((long)in_RDI + 0xb5) != 0) {
      (**(code **)(*in_RDI + 200))(in_RDI,*in_RSI,SStack_1c);
    }
  }
  else if (local_20 == pawn) {
    in_stack_ffffffffffffffd4 = *in_RSI - in_RSI[1];
    if (in_stack_ffffffffffffffd4 < 1) {
      in_stack_ffffffffffffffd4 = -in_stack_ffffffffffffffd4;
    }
    if (in_stack_ffffffffffffffd4 == 0x10) {
      *(int *)(in_RDI + 0x16) = (*in_RSI + in_RSI[1]) / 2;
    }
    else if (in_RSI[1] == *(int *)((long)in_RDX + 0x1c)) {
      in_stack_ffffffffffffffd0 = -8;
      if (SStack_1c == white) {
        in_stack_ffffffffffffffd0 = 8;
      }
      in_stack_ffffffffffffffd0 = in_RSI[1] + in_stack_ffffffffffffffd0;
      pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                         ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                          (long)in_stack_ffffffffffffffd0);
      *(value_type *)((long)in_RDX + 0x14) = *pvVar6;
      uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_stack_ffffffffffffffd0);
      in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
      std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                 (long)in_stack_ffffffffffffffd0);
      Piece::setEmpty((Piece *)0x1eb324);
    }
    else if (in_RSI[2] != 0) {
      uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_RSI[1]);
      in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
      PVar1 = in_RSI[2];
      pvVar6 = std::vector<banksia::Piece,_std::allocator<banksia::Piece>_>::operator[]
                         ((vector<banksia::Piece,_std::allocator<banksia::Piece>_> *)(in_RDI + 1),
                          (long)in_RSI[1]);
      pvVar6->type = PVar1;
      uVar8 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_RSI[1]);
      in_RDI[0xf] = uVar8 ^ in_RDI[0xf];
      *(undefined4 *)(in_RDI + 0xe) = 0;
    }
  }
  bVar3 = Piece::isEmpty((Piece *)((long)in_RDX + 0x14));
  if (!bVar3) {
    *(undefined4 *)(in_RDI + 0xe) = 0;
  }
  if (*(char *)((long)in_RDX + 0x25) != *(char *)((long)in_RDI + 0xb5)) {
    if (((int)*(char *)((long)in_RDX + 0x25) & *(uint *)((long)in_RDI + 0xa4)) !=
        ((int)*(char *)((long)in_RDI + 0xb5) & *(uint *)((long)in_RDI + 0xa4))) {
      in_RDI[0xf] = *RandomCastle ^ in_RDI[0xf];
    }
    if (((int)*(char *)((long)in_RDX + 0x25) & *(uint *)(in_RDI + 0x14)) !=
        ((int)*(char *)((long)in_RDI + 0xb5) & *(uint *)(in_RDI + 0x14))) {
      in_RDI[0xf] = RandomCastle[1] ^ in_RDI[0xf];
    }
  }
  if (*(char *)((long)in_RDX + 0x24) != *(char *)((long)in_RDI + 0xb4)) {
    if (((int)*(char *)((long)in_RDX + 0x24) & *(uint *)((long)in_RDI + 0xa4)) !=
        ((int)*(char *)((long)in_RDI + 0xb4) & *(uint *)((long)in_RDI + 0xa4))) {
      in_RDI[0xf] = RandomCastle[2] ^ in_RDI[0xf];
    }
    if (((int)*(char *)((long)in_RDX + 0x24) & *(uint *)(in_RDI + 0x14)) !=
        ((int)*(char *)((long)in_RDI + 0xb4) & *(uint *)(in_RDI + 0x14))) {
      in_RDI[0xf] = RandomCastle[3] ^ in_RDI[0xf];
    }
  }
  uVar7 = hashKeyEnpassant((ChessBoard *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           (int)((ulong)in_RDI >> 0x20));
  in_RDI[0xf] = uVar7 ^ in_RDI[0xf];
  return;
}

Assistant:

void ChessBoard::make(const MoveFull& move, Hist& hist) {
    assert(istHashKeyValid());
    
    hist.enpassant = enpassant;
    hist.status = status;
    hist.castleRights[0] = castleRights[0];
    hist.castleRights[1] = castleRights[1];
    hist.move = move;
    hist.cap = pieces[move.dest];
    hist.hashKey = hashKey;
    hist.quietCnt = quietCnt;
    
    hashKey ^= hashKeyEnpassant(enpassant);
    
    hashKey ^= xorHashKey(move.from);
    if (!hist.cap.isEmpty()) {
        hashKey ^= xorHashKey(move.dest);
    }
    
    auto p = pieces[move.from];
    pieces[move.dest] = p;
    pieces[move.from].setEmpty();
    
    hashKey ^= xorHashKey(move.dest);
    
    quietCnt++;
    enpassant = -1;
    
    if ((castleRights[0] + castleRights[1]) && hist.cap.type == PieceType::rook) {
        clearCastleRights(move.dest, hist.cap.side);
    }
    
    switch (p.type) {
        case PieceType::king: {
            castleRights[static_cast<int>(p.side)] &= ~(CastleRight_long|CastleRight_short);
            if (abs(move.from - move.dest) == 2) { // castle
                int rookPos = move.from + (move.from < move.dest ? 3 : -4);
                int newRookPos = (move.from + move.dest) / 2;
                
                hashKey ^= xorHashKey(rookPos);
                pieces[newRookPos] = pieces[rookPos];
                pieces[rookPos].setEmpty();
                hashKey ^= xorHashKey(newRookPos);
                quietCnt = 0;
            }
            break;
        }
            
        case PieceType::rook: {
            if (castleRights[0] + castleRights[1]) {
                clearCastleRights(move.from, p.side);
            }
            break;
        }
            
        case PieceType::pawn: {
            int d = abs(move.from - move.dest);
            
            if (d == 16) {
                enpassant = (move.from + move.dest) / 2;
            } else if (move.dest == hist.enpassant) {
                int ep = move.dest + (p.side == Side::white ? +8 : -8);
                hist.cap = pieces[ep];
                
                hashKey ^= xorHashKey(ep);
                pieces[ep].setEmpty();
            } else {
                if (move.promotion != PieceType::empty) {
                    hashKey ^= xorHashKey(move.dest);
                    pieces[move.dest].type = move.promotion;
                    hashKey ^= xorHashKey(move.dest);
                    quietCnt = 0;
                }
            }
            break;
        }
        default:
            break;
    }
    
    if (!hist.cap.isEmpty()) {
        quietCnt = 0;
    }
    
    if (hist.castleRights[W] != castleRights[W]) {
        if ((hist.castleRights[W] & CastleRight_short) != (castleRights[W] & CastleRight_short)) {
            hashKey ^= RandomCastle[0];
        }
        if ((hist.castleRights[W] & CastleRight_long) != (castleRights[W] & CastleRight_long)) {
            hashKey ^= RandomCastle[1];
        }
    }
    if (hist.castleRights[B] != castleRights[B]) {
        if ((hist.castleRights[B] & CastleRight_short) != (castleRights[B] & CastleRight_short)) {
            hashKey ^= RandomCastle[2];
        }
        if ((hist.castleRights[B] & CastleRight_long) != (castleRights[B] & CastleRight_long)) {
            hashKey ^= RandomCastle[3];
        }
    }
    
    hashKey ^= hashKeyEnpassant(enpassant);
}